

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O1

bool __thiscall QThreadPool::tryTake(QThreadPool *this,QRunnable *runnable)

{
  qsizetype *this_00;
  long lVar1;
  void *copy;
  QObjectData *pQVar2;
  QObject **ppQVar3;
  bool bVar4;
  long lVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QueuePage *page;
  QueuePage *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (runnable == (QRunnable *)0x0) {
    bVar6 = false;
    goto LAB_003d4031;
  }
  pQVar2 = (this->super_QObject).d_ptr.d;
  this_00 = &pQVar2[1].children.d.size;
  if (pQVar2[1].children.d.size == 0) {
    LOCK();
    lVar1 = *this_00;
    if (lVar1 == 0) {
      *this_00 = 1;
    }
    UNLOCK();
    if (lVar1 != 0) goto LAB_003d3f87;
  }
  else {
LAB_003d3f87:
    QBasicMutex::lockInternal((QBasicMutex *)this_00);
  }
  lVar1 = pQVar2[2].children.d.size;
  bVar6 = lVar1 != 0;
  if (bVar6) {
    ppQVar3 = pQVar2[2].children.d.ptr;
    lVar5 = 0;
    do {
      local_40 = *(QueuePage **)((long)ppQVar3 + lVar5);
      bVar4 = QueuePage::tryTake(local_40,runnable);
      if (bVar4) {
        if ((local_40->m_lastIndex < local_40->m_firstIndex) &&
           (QtPrivate::sequential_erase_one<QList<QueuePage*>,QueuePage*>
                      ((QList<QueuePage_*> *)&pQVar2[2].children,&local_40),
           local_40 != (QueuePage *)0x0)) {
          operator_delete(local_40,0x810);
        }
        if (bVar4) break;
      }
      lVar5 = lVar5 + 8;
      bVar6 = lVar1 << 3 != lVar5;
    } while (bVar6);
  }
  LOCK();
  copy = (void *)*this_00;
  *this_00 = 0;
  UNLOCK();
  if (copy != (void *)0x1) {
    QBasicMutex::unlockInternalFutex((QBasicMutex *)this_00,copy);
  }
LAB_003d4031:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool QThreadPool::tryTake(QRunnable *runnable)
{
    Q_D(QThreadPool);

    if (runnable == nullptr)
        return false;

    QMutexLocker locker(&d->mutex);
    for (QueuePage *page : std::as_const(d->queue)) {
        if (page->tryTake(runnable)) {
            if (page->isFinished()) {
                d->queue.removeOne(page);
                delete page;
            }
            return true;
        }
    }

    return false;
}